

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_keeper.h
# Opt level: O0

void __thiscall mp::ConstraintManager::ConstraintManager(ConstraintManager *this)

{
  std::
  map<double,_mp::BasicConstraintKeeper_&,_std::less<double>,_std::allocator<std::pair<const_double,_mp::BasicConstraintKeeper_&>_>_>
  ::map((map<double,_mp::BasicConstraintKeeper_&,_std::less<double>,_std::allocator<std::pair<const_double,_mp::BasicConstraintKeeper_&>_>_>
         *)0x166f98);
  MakeFileAppender();
  return;
}

Assistant:

void AddConstraintKeeper(BasicConstraintKeeper& ck, double priority) {
    auto insres = con_keepers_.insert( { priority, ck } );
    MP_ASSERT_ALWAYS(insres.second, "Duplicated constraint priority");
    ck.SetLogger(&*graph_exporter_app_);
  }